

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O3

void __thiscall lineage::SolutionGraph::save(SolutionGraph *this,string *fileNamePrefix)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer puVar3;
  char cVar4;
  string *psVar5;
  ostream *poVar6;
  pointer pVVar7;
  pointer pVVar8;
  ulong uVar9;
  unsigned_long *v;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream file;
  long *local_270 [2];
  long local_260 [2];
  undefined8 local_250;
  pointer local_248;
  string *local_240;
  ulong local_238;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  pcVar1 = (fileNamePrefix->_M_dataplus)._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + fileNamePrefix->_M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream(local_230,(string *)local_270,_S_out);
  local_240 = fileNamePrefix;
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if ((this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar9 = 0;
    do {
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)local_230,
                          *(int *)((long)(this->problemGraph_->problem_->nodes).
                                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
      local_270[0]._0_1_ = (string)0x9;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_270,1);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar6,
                          *(int *)((long)(this->problemGraph_->problem_->nodes).
                                         super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4 + lVar12));
      local_270[0] = (long *)CONCAT71(local_270[0]._1_7_,9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_270,1);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar9 < (ulong)((long)(this->cellOfNode_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->cellOfNode_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  local_230._0_8_ = _VTT;
  local_248 = _VTT;
  local_250 = _memcpy;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  psVar5 = local_240;
  pcVar1 = (local_240->_M_dataplus)._M_p;
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar1,pcVar1 + local_240->_M_string_length);
  std::__cxx11::string::append((char *)local_230);
  saveSolution((string *)local_230,this->solution_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
  }
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + psVar5->_M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream((ostream *)local_230,(string *)local_270,_S_out);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  if ((this->lineageGraph_).vertices_.
      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->lineageGraph_).vertices_.
      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pvVar2 = (this->nodesOfCell_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = *(pointer *)
                ((long)&pvVar2[uVar9].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_238 = uVar9;
      for (puVar10 = pvVar2[uVar9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
          puVar10 = puVar10 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"(",1);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)local_230,
                            *(int *)((long)(this->problemGraph_->problem_->nodes).
                                           super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    *puVar10 * 0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar6,
                            *(int *)((long)(this->problemGraph_->problem_->nodes).
                                           super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4 +
                                    *puVar10 * 0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
      }
      cVar4 = (char)(ostream *)local_230;
      std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      uVar9 = local_238 + 1;
    } while (uVar9 < (ulong)((long)(this->lineageGraph_).vertices_.
                                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->lineageGraph_).vertices_.
                                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::ofstream::close();
  local_230._0_8_ = local_248;
  *(undefined8 *)(local_230 + *(long *)(local_248 + -0x18)) = local_250;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  pcVar1 = (local_240->_M_dataplus)._M_p;
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,pcVar1,pcVar1 + local_240->_M_string_length);
  std::__cxx11::string::append((char *)local_270);
  std::ofstream::ofstream(local_230,(string *)local_270,_S_out);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  pVVar7 = (this->lineageGraph_).vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (this->lineageGraph_).vertices_.
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar7) {
    uVar9 = 0;
    do {
      if (pVVar7[uVar9].to_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          pVVar7[uVar9].to_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = 0;
        do {
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
          local_270[0] = (long *)CONCAT71(local_270[0]._1_7_,9);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_270,1);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pVVar7 = (this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)((long)pVVar7[uVar9].to_.vector_.
                                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)pVVar7[uVar9].to_.vector_.
                                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
        pVVar8 = (this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)pVVar8 - (long)pVVar7 >> 6));
  }
  std::ofstream::close();
  local_230._0_8_ = local_248;
  *(undefined8 *)(local_230 + *(long *)(local_248 + -0x18)) = local_250;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void save(std::string const& fileNamePrefix = "lineage") const
    {
        {
            std::ofstream file(fileNamePrefix + "-fragment-node-labels.txt");
            for (size_t v = 0; v < numberOfNodes(); ++v)
                file << problem().nodes[v].t
                    << '\t' << problem().nodes[v].id
                    << '\t' << cellOfNode(v)
                    << std::endl;
            
            file.close();
        }

        saveSolution(fileNamePrefix + "-fragment-edge-labels.txt", solution_);

        {
            std::ofstream file(fileNamePrefix + "-cell-nodes.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
            {
                for(auto& v: nodesOfCell_[c])
                    file << "(" << problem().nodes[v].t
                        << " " << problem().nodes[v].id
                        << ") ";
                
                file << std::endl;
            }

            file.close();
        }
        {
            std::ofstream file(fileNamePrefix + "-cell-edges.txt");
            for(size_t c = 0; c < numberOfCells(); ++c)
                for(size_t j = 0; j < lineageGraph_.numberOfEdgesFromVertex(c); ++j)
                    file << c << '\t' << lineageGraph_.vertexFromVertex(c, j) << std::endl;

            file.close();
        }
    }